

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_image_load_bricks(nifti_image *nim,int nbricks,int *blist,nifti_brick_list *NBL)

{
  size_t *psVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  znzFile fp_00;
  int iVar7;
  void *__ptr;
  void **ppvVar8;
  void *pvVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  size_t sVar19;
  long offset;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  znzFile fp;
  void *local_68;
  znzFile local_40;
  long local_38;
  
  if ((nim == (nifti_image *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",nim,NBL);
    return -1;
  }
  if (nbricks < 1 && blist != (int *)0x0) {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-d load_bricks: received blist with nbricks = %d,ignoring blist\n",
              (ulong)(uint)nbricks);
    }
LAB_00105da7:
    __ptr = (void *)0x0;
    bVar5 = true;
    local_68 = (void *)0x0;
  }
  else {
    if (blist == (int *)0x0) goto LAB_00105da7;
    iVar7 = valid_nifti_brick_list(nim,nbricks,blist,(uint)(0 < g_opts_0));
    if (iVar7 == 0) {
      return -1;
    }
    sVar19 = (long)nbricks << 2;
    __ptr = malloc(sVar19);
    local_68 = malloc(sVar19);
    if ((__ptr == (void *)0x0) || (local_68 == (void *)0x0)) {
      fprintf(_stderr,"** NCS: failed to alloc %d ints for sorting\n",(ulong)(uint)nbricks);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (local_68 == (void *)0x0) {
        return -1;
      }
      goto LAB_00105e01;
    }
    memcpy(__ptr,blist,sVar19);
    auVar6 = _DAT_00113020;
    if (nbricks < 1) {
LAB_00106059:
      uVar16 = nbricks - 1;
    }
    else {
      lVar10 = (ulong)(uint)nbricks - 1;
      auVar20._8_4_ = (int)lVar10;
      auVar20._0_8_ = lVar10;
      auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar12 = 0;
      auVar20 = auVar20 ^ _DAT_00113020;
      auVar21 = _DAT_00113010;
      do {
        auVar22 = auVar21 ^ auVar6;
        if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                    auVar20._4_4_ < auVar22._4_4_) & 1)) {
          *(int *)((long)local_68 + uVar12 * 4) = (int)uVar12;
        }
        if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
            auVar22._12_4_ <= auVar20._12_4_) {
          *(int *)((long)local_68 + uVar12 * 4 + 4) = (int)uVar12 + 1;
        }
        uVar12 = uVar12 + 2;
        lVar10 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 2;
        auVar21._8_8_ = lVar10 + 2;
      } while ((nbricks + 1U & 0xfffffffe) != uVar12);
      uVar16 = 0;
      if (nbricks != 1) {
        uVar12 = 1;
        uVar14 = 0;
        do {
          uVar18 = uVar14 & 0xffffffff;
          uVar15 = uVar12;
          do {
            uVar16 = (uint)uVar15;
            if (*(int *)((long)__ptr + (long)(int)(uint)uVar18 * 4) <=
                *(int *)((long)__ptr + uVar15 * 4)) {
              uVar16 = (uint)uVar18;
            }
            uVar15 = uVar15 + 1;
            uVar18 = (ulong)uVar16;
          } while ((uint)nbricks != uVar15);
          if (uVar14 != uVar16) {
            uVar2 = *(undefined4 *)((long)__ptr + uVar14 * 4);
            lVar10 = (long)(int)uVar16;
            *(undefined4 *)((long)__ptr + uVar14 * 4) = *(undefined4 *)((long)__ptr + lVar10 * 4);
            *(undefined4 *)((long)__ptr + lVar10 * 4) = uVar2;
            uVar2 = *(undefined4 *)((long)local_68 + uVar14 * 4);
            *(undefined4 *)((long)local_68 + uVar14 * 4) =
                 *(undefined4 *)((long)local_68 + lVar10 * 4);
            *(undefined4 *)((long)local_68 + lVar10 * 4) = uVar2;
          }
          uVar14 = uVar14 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar14 != nbricks - 1);
        goto LAB_00106059;
      }
    }
    if (2 < g_opts_0) {
      fwrite("+d sorted indexing list:\n",0x19,1,_stderr);
      fwrite("  orig   : ",0xb,1,_stderr);
      if (nbricks < 1) {
        nifti_image_load_bricks_cold_1();
      }
      else {
        nifti_image_load_bricks_cold_2();
      }
      fputc(10,_stderr);
    }
    uVar14 = 0;
    uVar12 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar12 = uVar14;
    }
    while (uVar12 != uVar14) {
      iVar7 = *(int *)((long)__ptr + uVar14 * 4);
      if ((*(int *)((long)__ptr + uVar14 * 4 + 4) < iVar7) ||
         (lVar10 = uVar14 * 4, uVar14 = uVar14 + 1,
         blist[*(int *)((long)local_68 + lVar10)] != iVar7)) {
        nifti_image_load_bricks_cold_3();
        return -1;
      }
    }
    if (2 < g_opts_0) {
      nifti_image_load_bricks_cold_4();
    }
    bVar5 = false;
  }
  local_40 = nifti_image_load_prep(nim);
  if (local_40 == (znzFile)0x0) {
    if (0 < g_opts_0) {
      nifti_image_load_bricks_cold_10();
    }
    if (bVar5) {
      return -1;
    }
    free(__ptr);
LAB_00105e01:
    free(local_68);
    return -1;
  }
  uVar12 = 0;
  if (!bVar5) {
    uVar12 = (ulong)(uint)nbricks;
  }
  if ((int)uVar12 < 1) {
    NBL->nbricks = 1;
    uVar16 = nim->ndim;
    nbricks = 1;
    if (3 < (int)uVar16) {
      nbricks = 1;
      lVar10 = 0;
      do {
        nbricks = nbricks * nim->dim[lVar10 + 4];
        NBL->nbricks = nbricks;
        lVar10 = lVar10 + 1;
      } while ((ulong)uVar16 - 3 != lVar10);
    }
  }
  else {
    NBL->nbricks = (int)uVar12;
  }
  sVar19 = (long)nim->nbyper * (long)nim->nz * (long)nim->ny * (long)nim->nx;
  NBL->bsize = sVar19;
  ppvVar8 = (void **)malloc((long)nbricks << 3);
  NBL->bricks = ppvVar8;
  if (ppvVar8 == (void **)0x0) {
    fprintf(_stderr,"** NANM: failed to alloc %d void ptrs\n",uVar12);
LAB_00106180:
    if (!bVar5) {
      free(__ptr);
      free(local_68);
    }
    Xznzclose(&local_40);
    return -1;
  }
  psVar1 = &NBL->bsize;
  if (0 < nbricks) {
    uVar12 = 0;
    do {
      pvVar9 = malloc(sVar19);
      ppvVar8[uVar12] = pvVar9;
      ppvVar8 = NBL->bricks;
      if (ppvVar8[uVar12] == (void *)0x0) {
        fprintf(_stderr,"** NANM: failed to alloc %u bytes for brick %d\n",sVar19 & 0xffffffff,
                uVar12 & 0xffffffff);
        if (uVar12 != 0) {
          lVar10 = uVar12 + 1;
          do {
            free(NBL->bricks[(int)lVar10 - 2]);
            lVar10 = lVar10 + -1;
          } while (1 < lVar10);
        }
        free(NBL->bricks);
        NBL->nbricks = 0;
        NBL->bsize = 0;
        NBL->bricks = (void **)0x0;
        goto LAB_00106180;
      }
      uVar12 = uVar12 + 1;
    } while ((uint)nbricks != uVar12);
  }
  if (2 < g_opts_0) {
    fprintf(_stderr,"+d NANM: alloc\'d %d bricks of %u bytes for NBL\n",(ulong)(uint)nbricks,
            sVar19 & 0xffffffff);
  }
  fp_00 = local_40;
  lVar10 = znztell(local_40);
  local_38 = lVar10;
  if (lVar10 < 0) {
    nifti_image_load_bricks_cold_9();
LAB_001062b4:
    nifti_free_NBL(NBL);
    NBL->nbricks = 0;
LAB_001062c2:
    if (__ptr == (void *)0x0) goto LAB_001062de;
  }
  else {
    if (__ptr == (void *)0x0) {
      uVar12 = (ulong)(uint)NBL->nbricks;
      if (0 < NBL->nbricks) {
        sVar11 = *psVar1;
        lVar10 = 0;
        do {
          sVar11 = nifti_read_buffer(fp_00,NBL->bricks[lVar10],sVar11,nim);
          if (sVar11 != NBL->bsize) {
            nifti_image_load_bricks_cold_8();
            goto LAB_001062b4;
          }
          lVar10 = lVar10 + 1;
          uVar12 = (ulong)NBL->nbricks;
        } while (lVar10 < (long)uVar12);
      }
      if (1 < g_opts_0) {
        pcVar17 = nim->iname;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = nim->fname;
        }
        fprintf(_stderr,"+d read %d default %u-byte bricks from file %s\n",uVar12,
                (ulong)(uint)*psVar1,pcVar17);
      }
      goto LAB_001062c2;
    }
    if (local_68 == (void *)0x0) {
      nifti_image_load_bricks_cold_7();
      goto LAB_001062b4;
    }
    if (0 < NBL->nbricks) {
      lVar13 = 0;
      iVar7 = -1;
      do {
        iVar3 = *(int *)((long)__ptr + lVar13 * 4);
        iVar4 = *(int *)((long)local_68 + lVar13 * 4);
        if (iVar3 == iVar7) {
          memcpy(NBL->bricks[iVar4],NBL->bricks[*(int *)((long)local_68 + lVar13 * 4 + -4)],
                 NBL->bsize);
        }
        else {
          sVar11 = *psVar1;
          offset = (long)iVar3 * sVar11 + local_38;
          if (lVar10 != offset) {
            lVar10 = znzseek(fp_00,offset,0);
            if (lVar10 < 0) {
              nifti_image_load_bricks_cold_5();
              goto LAB_001062b4;
            }
            sVar11 = *psVar1;
            lVar10 = offset;
          }
          sVar11 = nifti_read_buffer(fp_00,NBL->bricks[iVar4],sVar11,nim);
          if (sVar11 != NBL->bsize) {
            nifti_image_load_bricks_cold_6();
            goto LAB_001062b4;
          }
          lVar10 = lVar10 + sVar11;
        }
        lVar13 = lVar13 + 1;
        iVar7 = iVar3;
      } while (lVar13 < NBL->nbricks);
    }
  }
  free(__ptr);
  free(local_68);
LAB_001062de:
  Xznzclose(&local_40);
  return NBL->nbricks;
}

Assistant:

int nifti_image_load_bricks( nifti_image * nim , int nbricks,
                             const int * blist, nifti_brick_list * NBL )
{
   int     * slist = NULL, * sindex = NULL, rv;
   znzFile   fp;

   /* we can have blist == NULL */
   if( !nim || !NBL ){
      fprintf(stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",
              (void *)nim, (void *)NBL);
      return -1;
   }

   if( blist && nbricks <= 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d load_bricks: received blist with nbricks = %d,"
                        "ignoring blist\n", nbricks);
      blist = NULL; /* pretend nothing was passed */
   }

   if( blist && ! valid_nifti_brick_list(nim, nbricks, blist, g_opts.debug>0) )
      return -1;

   /* for efficiency, let's read the file in order */
   if( blist && nifti_copynsort( nbricks, blist, &slist, &sindex ) != 0 )
      return -1;

   /* open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );
   if( !fp ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load_bricks, failed load_prep\n");
      if( blist ){ free(slist); free(sindex); }
      return -1;
   }

   /* this will flag to allocate defaults */
   if( !blist ) nbricks = 0;
   if( nifti_alloc_NBL_mem( nim, nbricks, NBL ) != 0 ){
      if( blist ){ free(slist); free(sindex); }
      znzclose(fp);
      return -1;
   }

   rv = nifti_load_NBL_bricks(nim, slist, sindex, NBL, fp);

   if( rv != 0 ){
      nifti_free_NBL( NBL );  /* failure! */
      NBL->nbricks = 0; /* repetative, but clear */
   }

   if( slist ){ free(slist); free(sindex); }

   znzclose(fp);

   return NBL->nbricks;
}